

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLogLin>
               (GetterXsYs<float> *getter1,GetterXsYRef<float> *getter2,
               TransformerLogLin *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  double dVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterXsYRef<float> *local_50;
  TransformerLogLin *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar7 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLogLin>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLogLin>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar11 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar11 = getter1->Count;
    }
    if (0 < iVar11) {
      iVar12 = 0;
      do {
        pIVar8 = GImPlot;
        iVar5 = getter1->Count;
        lVar10 = (long)(((getter1->Offset + iVar12) % iVar5 + iVar5) % iVar5) *
                 (long)getter1->Stride;
        fVar2 = *(float *)((long)getter1->Ys + lVar10);
        dVar13 = log10((double)*(float *)((long)getter1->Xs + lVar10) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar9 = GImPlot;
        pIVar6 = pIVar8->CurrentPlot;
        dVar4 = (pIVar6->XAxis).Range.Min;
        iVar5 = transformer->YAxis;
        IVar3 = pIVar8->PixelRange[iVar5].Min;
        local_58._0_4_ =
             (undefined4)
             (pIVar8->Mx *
              (((double)(float)(dVar13 / pIVar8->LogDenX) * ((pIVar6->XAxis).Range.Max - dVar4) +
               dVar4) - dVar4) + (double)IVar3.x);
        local_58._4_4_ =
             (undefined4)
             (pIVar8->My[iVar5] * ((double)fVar2 - pIVar6->YAxis[iVar5].Range.Min) + (double)IVar3.y
             );
        iVar5 = getter2->Count;
        dVar4 = getter2->YRef;
        dVar14 = log10((double)*(float *)((long)getter2->Xs +
                                         (long)(((getter2->Offset + iVar12) % iVar5 + iVar5) % iVar5
                                               ) * (long)getter2->Stride) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar6 = pIVar9->CurrentPlot;
        dVar13 = (pIVar6->XAxis).Range.Min;
        iVar5 = transformer->YAxis;
        IVar3 = pIVar9->PixelRange[iVar5].Min;
        local_60.x = (float)(pIVar9->Mx *
                             (((double)(float)(dVar14 / pIVar9->LogDenX) *
                               ((pIVar6->XAxis).Range.Max - dVar13) + dVar13) - dVar13) +
                            (double)IVar3.x);
        local_60.y = (float)(pIVar9->My[iVar5] * (dVar4 - pIVar6->YAxis[iVar5].Range.Min) +
                            (double)IVar3.y);
        pIVar6 = pIVar7->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (local_60.y <= (float)local_58._4_4_) {
          fVar2 = local_60.y;
        }
        if ((fVar2 < (pIVar6->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(local_60.y <= (float)local_58._4_4_) & (uint)local_60.y |
                           local_58._4_4_ & -(uint)(local_60.y <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_60.x <= (float)local_58._0_4_) {
            fVar2 = local_60.x;
          }
          if ((fVar2 < (pIVar6->PlotRect).Max.x) &&
             (fVar2 = (float)(-(uint)(local_60.x <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(local_60.x <= (float)local_58._0_4_) & (uint)local_60.x),
             (pIVar6->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        iVar12 = iVar12 + 1;
      } while (iVar11 != iVar12);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}